

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

bool __thiscall luna::Table::SetArrayValue(Table *this,size_t index,Value *value)

{
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  long lVar2;
  ulong uVar3;
  
  if (index != 0) {
    pvVar1 = (this->array_)._M_t.
             super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
             ._M_head_impl;
    if (pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
      uVar3 = 1;
    }
    else {
      uVar3 = ((long)*(pointer *)
                      ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>
                              )._M_impl + 8) -
               *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                         _M_impl >> 4) + 1;
    }
    if (index <= uVar3) {
      if (uVar3 == index) {
        AppendAndMergeFromHashToArray(this,value);
        return true;
      }
      lVar2 = *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl;
      *(ValueT *)(lVar2 + -8 + index * 0x10) = value->type_;
      *(anon_union_8_9_8deb4486_for_Value_0 *)(lVar2 + -0x10 + index * 0x10) = value->field_0;
      return true;
    }
  }
  return false;
}

Assistant:

bool Table::SetArrayValue(std::size_t index, const Value &value)
    {
        if (index < 1)
            return false;

        std::size_t array_size = ArraySize();
        if (index > array_size + 1)
            return false;

        if (index == array_size + 1)
            AppendAndMergeFromHashToArray(value);
        else
            (*array_)[index - 1] = value;

        return true;
    }